

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O1

void __thiscall
OpenMD::ForceManager::selectedPreCalculation(ForceManager *this,Molecule *mol1,Molecule *mol2)

{
  Snapshot *this_00;
  Mat3x3d *pMVar1;
  uint i;
  long lVar2;
  long lVar3;
  Atom *pAVar4;
  RigidBody *pRVar5;
  CutoffGroup *pCVar6;
  pointer ppAVar7;
  pointer ppRVar8;
  pointer ppCVar9;
  potVec local_e8;
  potVec local_a8;
  potVec local_68;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  Snapshot::setBondPotential(this_00,0.0);
  Snapshot::setBendPotential(this_00,0.0);
  Snapshot::setTorsionPotential(this_00,0.0);
  Snapshot::setInversionPotential(this_00,0.0);
  local_68.data_[6] = 0.0;
  local_68.data_[4] = 0.0;
  local_68.data_[5] = 0.0;
  local_68.data_[2] = 0.0;
  local_68.data_[3] = 0.0;
  local_68.data_[0] = 0.0;
  local_68.data_[1] = 0.0;
  Snapshot::setLongRangePotentials(this_00,&local_68);
  local_a8.data_[6] = 0.0;
  local_a8.data_[4] = 0.0;
  local_a8.data_[5] = 0.0;
  local_a8.data_[2] = 0.0;
  local_a8.data_[3] = 0.0;
  local_a8.data_[0] = 0.0;
  local_a8.data_[1] = 0.0;
  Snapshot::setExcludedPotentials(this_00,&local_a8);
  if (this->doPotentialSelection_ == true) {
    local_e8.data_[4] = 0.0;
    local_e8.data_[5] = 0.0;
    local_e8.data_[2] = 0.0;
    local_e8.data_[3] = 0.0;
    local_e8.data_[0] = 0.0;
    local_e8.data_[1] = 0.0;
    local_e8.data_[6] = 0.0;
    Snapshot::setSelectionPotentials(this_00,&local_e8);
  }
  Snapshot::setRestraintPotential(this_00,0.0);
  Snapshot::setRawPotential(this_00,0.0);
  ppAVar7 = (mol1->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppAVar7 ==
      (mol1->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pAVar4 = (Atom *)0x0;
  }
  else {
    pAVar4 = *ppAVar7;
  }
  while (pAVar4 != (Atom *)0x0) {
    ppAVar7 = ppAVar7 + 1;
    StuntDouble::zeroForcesAndTorques(&pAVar4->super_StuntDouble);
    if (ppAVar7 ==
        (mol1->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pAVar4 = (Atom *)0x0;
    }
    else {
      pAVar4 = *ppAVar7;
    }
  }
  ppRVar8 = (mol1->rigidBodies_).
            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppRVar8 ==
      (mol1->rigidBodies_).
      super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pRVar5 = (RigidBody *)0x0;
  }
  else {
    pRVar5 = *ppRVar8;
  }
  while (pRVar5 != (RigidBody *)0x0) {
    ppRVar8 = ppRVar8 + 1;
    StuntDouble::zeroForcesAndTorques(&pRVar5->super_StuntDouble);
    if (ppRVar8 ==
        (mol1->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pRVar5 = (RigidBody *)0x0;
    }
    else {
      pRVar5 = *ppRVar8;
    }
  }
  if (this->info_->nGlobalCutoffGroups_ != this->info_->nGlobalAtoms_) {
    ppCVar9 = (mol1->cutoffGroups_).
              super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppCVar9 ==
        (mol1->cutoffGroups_).
        super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pCVar6 = (CutoffGroup *)0x0;
    }
    else {
      pCVar6 = *ppCVar9;
    }
    while (pCVar6 != (CutoffGroup *)0x0) {
      ppCVar9 = ppCVar9 + 1;
      CutoffGroup::updateCOM(pCVar6);
      if (ppCVar9 ==
          (mol1->cutoffGroups_).
          super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pCVar6 = (CutoffGroup *)0x0;
      }
      else {
        pCVar6 = *ppCVar9;
      }
    }
  }
  ppAVar7 = (mol2->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppAVar7 ==
      (mol2->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pAVar4 = (Atom *)0x0;
  }
  else {
    pAVar4 = *ppAVar7;
  }
  while (pAVar4 != (Atom *)0x0) {
    ppAVar7 = ppAVar7 + 1;
    StuntDouble::zeroForcesAndTorques(&pAVar4->super_StuntDouble);
    if (ppAVar7 ==
        (mol2->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pAVar4 = (Atom *)0x0;
    }
    else {
      pAVar4 = *ppAVar7;
    }
  }
  ppRVar8 = (mol2->rigidBodies_).
            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppRVar8 ==
      (mol2->rigidBodies_).
      super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pRVar5 = (RigidBody *)0x0;
  }
  else {
    pRVar5 = *ppRVar8;
  }
  while (pRVar5 != (RigidBody *)0x0) {
    ppRVar8 = ppRVar8 + 1;
    StuntDouble::zeroForcesAndTorques(&pRVar5->super_StuntDouble);
    if (ppRVar8 ==
        (mol2->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pRVar5 = (RigidBody *)0x0;
    }
    else {
      pRVar5 = *ppRVar8;
    }
  }
  if (this->info_->nGlobalCutoffGroups_ != this->info_->nGlobalAtoms_) {
    ppCVar9 = (mol2->cutoffGroups_).
              super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppCVar9 ==
        (mol2->cutoffGroups_).
        super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pCVar6 = (CutoffGroup *)0x0;
    }
    else {
      pCVar6 = *ppCVar9;
    }
    while (pCVar6 != (CutoffGroup *)0x0) {
      ppCVar9 = ppCVar9 + 1;
      CutoffGroup::updateCOM(pCVar6);
      if (ppCVar9 ==
          (mol2->cutoffGroups_).
          super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pCVar6 = (CutoffGroup *)0x0;
      }
      else {
        pCVar6 = *ppCVar9;
      }
    }
  }
  pMVar1 = &this->virialTensor;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      (pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar3] =
           (pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar3]
           * 0.0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar2 = lVar2 + 1;
    pMVar1 = (Mat3x3d *)
             ((pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar2 != 3);
  (*this->fDecomp_->_vptr_ForceDecomposition[0x2e])();
  return;
}

Assistant:

void ForceManager::selectedPreCalculation(Molecule* mol1, Molecule* mol2) {
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Atom* atom;
    Molecule::RigidBodyIterator rbIter;
    RigidBody* rb;
    Molecule::CutoffGroupIterator ci;
    CutoffGroup* cg;

    // forces and potentials are zeroed here, before any are
    // accumulated.

    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    snap->setBondPotential(0.0);
    snap->setBendPotential(0.0);
    snap->setTorsionPotential(0.0);
    snap->setInversionPotential(0.0);

    potVec zeroPot(0.0);
    snap->setLongRangePotentials(zeroPot);
    snap->setExcludedPotentials(zeroPot);
    if (doPotentialSelection_) snap->setSelectionPotentials(zeroPot);

    snap->setRestraintPotential(0.0);
    snap->setRawPotential(0.0);

    // First we zero out for mol1
    for (atom = mol1->beginAtom(ai); atom != NULL; atom = mol1->nextAtom(ai)) {
      atom->zeroForcesAndTorques();
    }
    // change the positions of atoms which belong to the rigidbodies
    for (rb = mol1->beginRigidBody(rbIter); rb != NULL;
         rb = mol1->nextRigidBody(rbIter)) {
      rb->zeroForcesAndTorques();
    }
    if (info_->getNGlobalCutoffGroups() != info_->getNGlobalAtoms()) {
      for (cg = mol1->beginCutoffGroup(ci); cg != NULL;
           cg = mol1->nextCutoffGroup(ci)) {
        // calculate the center of mass of cutoff group
        cg->updateCOM();
      }
    }

    // Next we zero out for mol2
    for (atom = mol2->beginAtom(ai); atom != NULL; atom = mol2->nextAtom(ai)) {
      atom->zeroForcesAndTorques();
    }
    // change the positions of atoms which belong to the rigidbodies
    for (rb = mol2->beginRigidBody(rbIter); rb != NULL;
         rb = mol2->nextRigidBody(rbIter)) {
      rb->zeroForcesAndTorques();
    }
    if (info_->getNGlobalCutoffGroups() != info_->getNGlobalAtoms()) {
      for (cg = mol2->beginCutoffGroup(ci); cg != NULL;
           cg = mol2->nextCutoffGroup(ci)) {
        // calculate the center of mass of cutoff group
        cg->updateCOM();
      }
    }

    // Zero out the virial tensor
    virialTensor *= 0.0;
    // Zero out the heatFlux
    fDecomp_->setHeatFlux(Vector3d(0.0));
  }